

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

void CopyPlane(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_y = dst_y + ~height * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  if (dst_stride_y == width && src_stride_y == width) {
    width = width * iVar1;
    iVar1 = 1;
    src_stride_y = 0;
    dst_stride_y = 0;
  }
  if (dst_y != src_y || src_stride_y != dst_stride_y) {
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0x1fU) == 0) {
      pcVar3 = CopyRow_SSE2;
    }
    else {
      pcVar3 = CopyRow_Any_SSE2;
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar3 = CopyRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0x3fU) == 0) {
      pcVar4 = CopyRow_AVX;
    }
    else {
      pcVar4 = CopyRow_Any_AVX;
    }
    if ((uVar2 >> 9 & 1) == 0) {
      pcVar4 = pcVar3;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      pcVar4 = CopyRow_ERMS;
    }
    if (0 < iVar1) {
      do {
        (*pcVar4)(src_y,dst_y,width);
        src_y = src_y + src_stride_y;
        dst_y = dst_y + dst_stride_y;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

LIBYUV_API
void CopyPlane(const uint8_t* src_y,
               int src_stride_y,
               uint8_t* dst_y,
               int dst_stride_y,
               int width,
               int height) {
  int y;
  void (*CopyRow)(const uint8_t* src, uint8_t* dst, int width) = CopyRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
  // Nothing to do.
  if (src_y == dst_y && src_stride_y == dst_stride_y) {
    return;
  }

#if defined(HAS_COPYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    CopyRow = IS_ALIGNED(width, 32) ? CopyRow_SSE2 : CopyRow_Any_SSE2;
  }
#endif
#if defined(HAS_COPYROW_AVX)
  if (TestCpuFlag(kCpuHasAVX)) {
    CopyRow = IS_ALIGNED(width, 64) ? CopyRow_AVX : CopyRow_Any_AVX;
  }
#endif
#if defined(HAS_COPYROW_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    CopyRow = CopyRow_ERMS;
  }
#endif
#if defined(HAS_COPYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    CopyRow = IS_ALIGNED(width, 32) ? CopyRow_NEON : CopyRow_Any_NEON;
  }
#endif

  // Copy plane
  for (y = 0; y < height; ++y) {
    CopyRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}